

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnBackward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *U,
          DecomposeType dec)

{
  int iVar1;
  int *piVar2;
  complex<double> *__z;
  int in_EDX;
  complex<double> *in_RSI;
  TPZEqnArray<std::complex<double>_> *in_RDI;
  undefined4 uVar3;
  undefined4 uVar4;
  int i_1;
  complex<double> acum_1;
  int last_term_1;
  int index_1;
  int i;
  complex<double> acum;
  int last_term;
  int index;
  int n;
  complex<double> *in_stack_ffffffffffffff28;
  complex<double> *in_stack_ffffffffffffff30;
  complex<double> *in_stack_ffffffffffffff38;
  complex<double> *in_stack_ffffffffffffff40;
  complex<double> *in_stack_ffffffffffffff48;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff50;
  int local_64;
  complex<double> local_60;
  int local_50;
  int local_4c;
  undefined8 local_40;
  int local_34;
  complex<double> local_30;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  complex<double> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar1 = IsSymmetric(in_RDI);
  if (iVar1 == 1) {
    local_18 = in_RDI->fNumEq;
    while (local_18 = local_18 + -1, -1 < local_18) {
      piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      local_1c = *piVar2;
      piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
      local_20 = *piVar2;
      uVar3 = 0;
      uVar4 = 0;
      std::complex<double>::complex(&local_30,0.0,0.0);
      local_34 = local_1c;
      while (local_34 = local_34 + 1, local_34 < local_20) {
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_34);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,
                   (int64_t)in_stack_ffffffffffffff40);
        TPZVec<std::complex<double>_>::operator[]
                  ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_34);
        std::operator*(in_stack_ffffffffffffff28,(complex<double> *)0x1d6c7c6);
        local_40 = CONCAT44(uVar4,uVar3);
        std::complex<double>::operator-=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
      TPZFMatrix<std::complex<double>_>::operator()
                (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,
                 (int64_t)in_stack_ffffffffffffff40);
      std::complex<double>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (local_14 == 3) {
        TPZVec<std::complex<double>_>::operator[]
                  ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_1c);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,
                   (int64_t)in_stack_ffffffffffffff40);
        std::complex<double>::operator/=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
  }
  else {
    iVar1 = IsSymmetric(in_RDI);
    if (iVar1 == 2) {
      local_18 = in_RDI->fNumEq;
      while (local_18 = local_18 + -2, -1 < local_18) {
        piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        local_4c = *piVar2;
        piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
        local_50 = *piVar2;
        std::complex<double>::complex(&local_60,0.0,0.0);
        local_64 = local_4c;
        while (local_64 = local_64 + 1, local_64 < local_50) {
          in_stack_ffffffffffffff48 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_64);
          in_stack_ffffffffffffff50 =
               (TPZFMatrix<std::complex<double>_> *)
               TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,
                          (int64_t)in_stack_ffffffffffffff40);
          TPZVec<std::complex<double>_>::operator[]
                    ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_64);
          std::operator*(in_stack_ffffffffffffff28,(complex<double> *)0x1d6c9d4);
          std::complex<double>::operator-=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        in_stack_ffffffffffffff40 = local_10;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_4c);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,
                   (int64_t)in_stack_ffffffffffffff40);
        std::complex<double>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if ((local_14 == 3) || (local_14 == 1)) {
          __z = TPZVec<std::complex<double>_>::operator[]
                          ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_4c);
          in_stack_ffffffffffffff30 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_4c);
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,
                     (int64_t)in_stack_ffffffffffffff40);
          std::complex<double>::operator/=(in_stack_ffffffffffffff40,__z);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}